

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

bool Fixpp::impl::
     doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul>
               (FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_> *message,uint tag,
               FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_9_>,_Fixpp::Required<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<434U,_Fixpp::Type::Char>_>,_Fixpp::TagT<102U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
               *visitor)

{
  unsigned_long *puVar1;
  uint local_2c [2];
  int index;
  
  local_2c[0] = 0xffffffff;
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,message,visitor,(int *)local_2c);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<198u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<198U,_Fixpp::Type::String>_> *)(message + 1),visitor,
             (int *)local_2c);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_> *)(message + 2),visitor,
             (int *)local_2c);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<41U,_Fixpp::Type::String>_> *)(message + 3),visitor,
             (int *)local_2c);
  doVisitSingleField<4ul,Fixpp::FieldRef<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<39U,_Fixpp::Type::Char>_> *)(message + 4),visitor,
             (int *)local_2c);
  doVisitSingleField<5ul,Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_> *)(message + 5),visitor,
             (int *)local_2c);
  doVisitSingleField<6ul,Fixpp::FieldRef<Fixpp::TagT<76u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<76U,_Fixpp::Type::String>_> *)(message + 6),visitor,
             (int *)local_2c);
  doVisitSingleField<7ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_> *)(message + 7),visitor,
             (int *)local_2c);
  doVisitSingleField<8ul,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_> *)(message + 8),visitor,
             (int *)local_2c);
  doVisitSingleField<9ul,Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_> *)(message + 9),visitor,
             (int *)local_2c);
  doVisitSingleField<10ul,Fixpp::FieldRef<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<434U,_Fixpp::Type::Char>_> *)(message + 10),visitor,
             (int *)local_2c);
  doVisitSingleField<11ul,Fixpp::FieldRef<Fixpp::TagT<102u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<102U,_Fixpp::Type::Int>_> *)(message + 0xb),visitor,
             (int *)local_2c);
  doVisitSingleField<12ul,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_> *)(message + 0xc),visitor,
             (int *)local_2c);
  doVisitSingleField<13ul,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_> *)(message + 0xd),visitor,
             (int *)local_2c);
  doVisitSingleField<14ul,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)57>,Fixpp::Required<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<434u,Fixpp::Type::Char>>,Fixpp::TagT<102u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
            (tag,(FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_> *)(message + 0xe),visitor,
             (int *)local_2c);
  if ((long)(int)local_2c[0] != -1) {
    if (0xe < local_2c[0]) {
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                 (long)(int)local_2c[0],0xf);
    }
    puVar1 = &message[0xf].m_view.second;
    *puVar1 = *puVar1 | 1L << ((byte)local_2c[0] & 0x3f);
  }
  return local_2c[0] != 0xffffffff;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }